

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

mz_bool tdefl_compress_mem_to_output
                  (void *pBuf,size_t buf_len,tdefl_put_buf_func_ptr pPut_buf_func,
                  void *pPut_buf_user,int flags)

{
  tdefl_status tVar1;
  tdefl_compressor *d;
  uint uVar2;
  
  uVar2 = 0;
  if (pPut_buf_func != (tdefl_put_buf_func_ptr)0x0 && (pBuf != (void *)0x0 || buf_len == 0)) {
    d = (tdefl_compressor *)malloc(0x4df78);
    if (d != (tdefl_compressor *)0x0) {
      tdefl_init(d,pPut_buf_func,pPut_buf_user,flags);
      tVar1 = tdefl_compress_buffer(d,pBuf,buf_len,TDEFL_FINISH);
      uVar2 = (uint)(tVar1 == TDEFL_STATUS_DONE);
      free(d);
    }
  }
  return uVar2;
}

Assistant:

mz_bool tdefl_compress_mem_to_output(const void *pBuf, size_t buf_len,
                                     tdefl_put_buf_func_ptr pPut_buf_func,
                                     void *pPut_buf_user, int flags) {
  tdefl_compressor *pComp;
  mz_bool succeeded;
  if (((buf_len) && (!pBuf)) || (!pPut_buf_func))
    return MZ_FALSE;
  pComp = (tdefl_compressor *)MZ_MALLOC(sizeof(tdefl_compressor));
  if (!pComp)
    return MZ_FALSE;
  succeeded = (tdefl_init(pComp, pPut_buf_func, pPut_buf_user, flags) ==
               TDEFL_STATUS_OKAY);
  succeeded =
      succeeded && (tdefl_compress_buffer(pComp, pBuf, buf_len, TDEFL_FINISH) ==
                    TDEFL_STATUS_DONE);
  MZ_FREE(pComp);
  return succeeded;
}